

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastzip.h
# Opt level: O0

void __thiscall PathAlias::~PathAlias(PathAlias *this)

{
  PathAlias *this_local;
  
  std::__cxx11::string::~string((string *)&this->aliasTo);
  std::experimental::filesystem::v1::__cxx11::path::~path(&this->diskPath);
  return;
}

Assistant:

PathAlias(const std::string& alias)
    {
        auto parts = split(alias, "=");
        if (parts.size() > 1) {
            diskPath = parts[0];
            aliasTo = parts[1];
        } else
            diskPath = alias;
    }